

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zeCommandListIsImmediate(ze_command_list_handle_t hCommandList,ze_bool_t *pIsImmediate)

{
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hCommandList + 8) + 0x318) != (code *)0x0) {
    zVar1 = (**(code **)(*(long *)(hCommandList + 8) + 0x318))(*(undefined8 *)hCommandList);
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListIsImmediate(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        ze_bool_t* pIsImmediate                         ///< [out] Boolean indicating whether the command list is an immediate
                                                        ///< command list (true) or not (false)
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->dditable;
        auto pfnIsImmediate = dditable->ze.CommandList.pfnIsImmediate;
        if( nullptr == pfnIsImmediate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandList = reinterpret_cast<ze_command_list_object_t*>( hCommandList )->handle;

        // forward to device-driver
        result = pfnIsImmediate( hCommandList, pIsImmediate );

        return result;
    }